

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwGetCursorPos(GLFWwindow *handle,double *xpos,double *ypos)

{
  _GLFWwindow *window;
  double *ypos_local;
  double *xpos_local;
  GLFWwindow *handle_local;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                  ,0x30b,"void glfwGetCursorPos(GLFWwindow *, double *, double *)");
  }
  if (xpos != (double *)0x0) {
    *xpos = 0.0;
  }
  if (ypos != (double *)0x0) {
    *ypos = 0.0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (*(int *)(handle + 0x84) == 0x34003) {
    if (xpos != (double *)0x0) {
      *xpos = *(double *)(handle + 0x1f0);
    }
    if (ypos != (double *)0x0) {
      *ypos = *(double *)(handle + 0x1f8);
    }
  }
  else {
    (*_glfw.platform.getCursorPos)((_GLFWwindow *)handle,xpos,ypos);
  }
  return;
}

Assistant:

GLFWAPI void glfwGetCursorPos(GLFWwindow* handle, double* xpos, double* ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;

    _GLFW_REQUIRE_INIT();

    if (window->cursorMode == GLFW_CURSOR_DISABLED)
    {
        if (xpos)
            *xpos = window->virtualCursorPosX;
        if (ypos)
            *ypos = window->virtualCursorPosY;
    }
    else
        _glfw.platform.getCursorPos(window, xpos, ypos);
}